

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall Alice::ObliviousTranslate(Alice *this)

{
  long *plVar1;
  long addr;
  Alice *pAVar2;
  Message MVar3;
  Message local_d0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_c0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_a8;
  undefined1 local_90 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> Perm_D;
  long local_68;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_60;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_48;
  undefined1 local_30 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> Perm_P;
  
  pAVar2 = (Alice *)&(this->super_Party).P;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&local_c0,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)pAVar2);
  ExtractPermutationShare
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_30,
             pAVar2,&local_c0,(this->super_Party).n_p,5);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_c0);
  pAVar2 = (Alice *)&(this->super_Party).D;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&local_a8,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)pAVar2);
  ExtractPermutationShare
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_90,
             pAVar2,&local_a8,(this->super_Party).n_d,2);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_a8);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             &Perm_D.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_30);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (&local_60,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_90);
  ObliviousTranslate(this,(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                          &Perm_D.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_60);
  if (local_60.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (Perm_D.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(Perm_D.
                    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_68 -
                    (long)Perm_D.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  addr = (this->super_Party).pc;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (&local_48,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_30);
  local_d0.scalar1 = ObliviousTranslateSingleAddress(this,addr,&local_48);
  (this->super_Party).pc = local_d0.scalar1;
  if (local_48.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    local_d0.scalar1 = (this->super_Party).pc;
  }
  local_d0.scalar2 = 0;
  Server::Send(this->srv,&local_d0);
  MVar3 = Server::Receive(this->srv);
  plVar1 = &(this->super_Party).pc;
  *plVar1 = *plVar1 + MVar3.scalar1;
  UpdateAlphas(this);
  if (local_90 != (undefined1  [8])0x0) {
    operator_delete((void *)local_90,
                    (long)Perm_D.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_90);
  }
  if (local_30 != (undefined1  [8])0x0) {
    operator_delete((void *)local_30,
                    (long)Perm_P.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_30);
  }
  return;
}

Assistant:

void Alice::ObliviousTranslate()
{
    std::vector<std::pair<long,long>> Perm_P = ExtractPermutationShare(P, n_p, 5);
    std::vector<std::pair<long,long>> Perm_D = ExtractPermutationShare(D, n_d, 2);
    ObliviousTranslate(Perm_P, Perm_D);
    pc = ObliviousTranslateSingleAddress(pc, Perm_P);
    Message msg_for_Bob, msg_from_Bob;
    msg_for_Bob.scalar1 = pc;
    srv->Send(msg_for_Bob);
    msg_from_Bob = srv->Receive();
    pc = pc + msg_from_Bob.scalar1;
    UpdateAlphas();  
}